

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O1

int flvtag_amfcaption_708(flvtag_t *tag,uint32_t timestamp,sei_message_t *msg)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  size_t sVar4;
  uint8_t *puVar5;
  byte *pbVar6;
  size_t sVar7;
  ulong uVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  uint uVar11;
  uint8_t uVar12;
  ulong uVar13;
  
  flvtag_initamf(tag,timestamp);
  sVar4 = sei_message_size(msg);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = sVar4 + 2;
  uVar13 = SUB168(auVar2 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffc;
  uVar8 = (ulong)((int)uVar13 + 0x3d);
  if (tag->aloc < uVar8) {
    puVar5 = (uint8_t *)realloc(tag->data,uVar8);
    tag->data = puVar5;
    tag->aloc = uVar8;
  }
  sVar4 = flvtag_header_size(tag);
  puVar9 = tag->data;
  puVar5 = puVar9 + sVar4;
  puVar5[0] = '\x02';
  puVar5[1] = '\0';
  puVar5[2] = '\r';
  puVar5[3] = 'o';
  puVar5[4] = 'n';
  puVar5[5] = 'C';
  puVar5[6] = 'a';
  puVar5[7] = 'p';
  puVar5[8] = 't';
  puVar5[9] = 'i';
  puVar5[10] = 'o';
  puVar5[0xb] = 'n';
  puVar5[0xc] = 'I';
  puVar5[0xd] = 'n';
  puVar5[0xe] = 'f';
  puVar5[0xf] = 'o';
  puVar5 = puVar9 + sVar4 + 0x10;
  puVar5[0] = '\b';
  puVar5[1] = '\0';
  puVar5[2] = '\0';
  puVar5[3] = '\0';
  puVar5[4] = '\x02';
  puVar5[5] = '\0';
  puVar5[6] = '\x04';
  puVar5[7] = 't';
  puVar5[8] = 'y';
  puVar5[9] = 'p';
  puVar5[10] = 'e';
  puVar5[0xb] = '\x02';
  puVar5[0xc] = '\0';
  puVar5[0xd] = '\x03';
  puVar5[0xe] = '7';
  puVar5[0xf] = '0';
  puVar9 = puVar9 + sVar4 + 0x1a;
  puVar9[0] = 'e';
  puVar9[1] = '\x02';
  puVar9[2] = '\0';
  puVar9[3] = '\x03';
  puVar9[4] = '7';
  puVar9[5] = '0';
  puVar9[6] = '8';
  puVar9[7] = '\0';
  puVar9[8] = '\x04';
  puVar9[9] = 'd';
  puVar9[10] = 'a';
  puVar9[0xb] = 't';
  puVar9[0xc] = 'a';
  puVar9[0xd] = '\x02';
  puVar9[0xe] = '\0';
  puVar9[0xf] = '\0';
  sVar4 = flvtag_header_size(tag);
  puVar5 = tag->data;
  pbVar6 = sei_message_data(msg);
  sVar7 = sei_message_size(msg);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = sVar7 + 2;
  uVar8 = SUB168(auVar3 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffc;
  if (uVar13 < uVar8) {
    uVar8 = uVar8 | 1;
  }
  else {
    puVar10 = puVar5 + sVar4 + 0x2a;
    uVar13 = (sVar7 / 3) * 3;
    uVar8 = 0;
    puVar9 = puVar10;
    if (uVar13 != 0) {
      do {
        *puVar9 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [pbVar6[uVar8] >> 2];
        puVar9[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(byte)(pbVar6[uVar8] << 4 | pbVar6[uVar8 + 1] >> 4) & 0x3f];
        puVar9[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(byte)(pbVar6[uVar8 + 1] << 2 | pbVar6[uVar8 + 2] >> 6) & 0x3f];
        puVar9[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [pbVar6[uVar8 + 2] & 0x3f];
        puVar9 = puVar9 + 4;
        uVar8 = uVar8 + 3;
      } while (uVar8 < uVar13);
      pbVar6 = pbVar6 + uVar8;
    }
    if (uVar8 < sVar7) {
      bVar1 = *pbVar6;
      uVar11 = 0;
      if (uVar8 + 1 < sVar7) {
        uVar11 = (uint)pbVar6[1];
      }
      *puVar9 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2];
      puVar9[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(bVar1 & 3) << 4 | uVar11 >> 4];
      uVar12 = '=';
      if (uVar8 + 1 < sVar7) {
        uVar12 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(ulong)(uVar11 & 0xf) * 4];
      }
      puVar9[2] = uVar12;
      puVar9[3] = '=';
      puVar9 = puVar9 + 4;
    }
    uVar8 = (long)puVar9 - (long)puVar10;
  }
  *(ushort *)(puVar5 + sVar4 + 0x28) = (ushort)uVar8 << 8 | (ushort)uVar8 >> 8;
  (puVar5 + uVar8 + sVar4 + 0x2a)[0] = '\0';
  (puVar5 + uVar8 + sVar4 + 0x2a)[1] = '\0';
  puVar5[uVar8 + sVar4 + 0x2c] = '\t';
  flvtag_updatesize(tag,(int)uVar8 + 0x2d);
  return 1;
}

Assistant:

int flvtag_amfcaption_708(flvtag_t* tag, uint32_t timestamp, sei_message_t* msg)
{
    flvtag_initamf(tag, timestamp);
    unsigned long size = 1 + (4 * ((sei_message_size(msg) + 2) / 3));
    flvtag_reserve(tag, sizeof(onCaptionInfo708) + size + 3);
    memcpy(flvtag_payload_data(tag), onCaptionInfo708, sizeof(onCaptionInfo708));
    uint8_t* data = flvtag_payload_data(tag) + sizeof(onCaptionInfo708);
    base64_encode(sei_message_data(msg), sei_message_size(msg), data, &size);

    // Update the size of the base64 string
    data[-2] = size >> 8;
    data[-1] = size >> 0;
    // write the last array element
    data[size + 0] = 0x00;
    data[size + 1] = 0x00;
    data[size + 2] = 0x09;
    flvtag_updatesize(tag, sizeof(onCaptionInfo708) + size + 3);

    return 1;
}